

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O3

void __thiscall GraphTestNestedPhonyPrintsDone::Run(GraphTestNestedPhonyPrintsDone *this)

{
  Test *pTVar1;
  bool bVar2;
  int iVar3;
  Node *pNVar4;
  string err;
  Plan plan_;
  string local_d8;
  string local_b8;
  undefined1 local_98 [48];
  _Rb_tree<Edge_*,_Edge_*,_std::_Identity<Edge_*>,_std::less<Edge_*>,_std::allocator<Edge_*>_>
  local_68;
  int local_30;
  int local_2c;
  
  AssertParse(&(this->super_GraphTest).super_StateTestWithBuiltinRules.state_,
              "build n1: phony \nbuild n2: phony n1\n",(ManifestParserOptions)0x0);
  pTVar1 = g_current_test;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  local_98._0_8_ = local_98 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"n2","");
  pNVar4 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,(string *)local_98);
  bVar2 = DependencyScan::RecomputeDirty(&(this->super_GraphTest).scan_,pNVar4,&local_d8);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
             ,0x13d,"scan_.RecomputeDirty(GetNode(\"n2\"), &err)");
  if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
    operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
  }
  pTVar1 = g_current_test;
  iVar3 = std::__cxx11::string::compare((char *)&local_d8);
  bVar2 = testing::Test::Check
                    (pTVar1,iVar3 == 0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
                     ,0x13e,"\"\" == err");
  if (!bVar2) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    goto LAB_00162186;
  }
  Plan::Plan((Plan *)local_98,(Builder *)0x0);
  pTVar1 = g_current_test;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"n2","");
  pNVar4 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_b8);
  bVar2 = Plan::AddTarget((Plan *)local_98,pNVar4,&local_d8);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
             ,0x141,"plan_.AddTarget(GetNode(\"n2\"), &err)");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  pTVar1 = g_current_test;
  iVar3 = std::__cxx11::string::compare((char *)&local_d8);
  bVar2 = testing::Test::Check
                    (pTVar1,iVar3 == 0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
                     ,0x142,"\"\" == err");
  if (bVar2) {
    testing::Test::Check
              (g_current_test,local_30 == 0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
               ,0x144,"0 == plan_.command_edge_count()");
    bVar2 = testing::Test::Check
                      (g_current_test,local_30 < 1 || local_2c < 1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
                       ,0x145,"plan_.more_to_do()");
    if (!bVar2) goto LAB_00162166;
  }
  else {
LAB_00162166:
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  std::_Rb_tree<Edge_*,_Edge_*,_std::_Identity<Edge_*>,_std::less<Edge_*>,_std::allocator<Edge_*>_>
  ::~_Rb_tree(&local_68);
  std::
  _Rb_tree<Edge_*,_std::pair<Edge_*const,_Plan::Want>,_std::_Select1st<std::pair<Edge_*const,_Plan::Want>_>,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Plan::Want>_>_>
  ::~_Rb_tree((_Rb_tree<Edge_*,_std::pair<Edge_*const,_Plan::Want>,_std::_Select1st<std::pair<Edge_*const,_Plan::Want>_>,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Plan::Want>_>_>
               *)local_98);
LAB_00162186:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                             local_d8.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

TEST_F(GraphTest, NestedPhonyPrintsDone) {
  AssertParse(&state_,
"build n1: phony \n"
"build n2: phony n1\n"
  );
  string err;
  EXPECT_TRUE(scan_.RecomputeDirty(GetNode("n2"), &err));
  ASSERT_EQ("", err);

  Plan plan_;
  EXPECT_TRUE(plan_.AddTarget(GetNode("n2"), &err));
  ASSERT_EQ("", err);

  EXPECT_EQ(0, plan_.command_edge_count());
  ASSERT_FALSE(plan_.more_to_do());
}